

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  char (*in_R9) [2];
  uint __val;
  bool bVar5;
  spirv_cross local_1e0 [32];
  string local_1c0;
  string subexpr;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  iVar1 = *(int *)&(type->super_IVariant).field_0xc;
  if (iVar1 == 2 && *(int *)&(parent_type->super_IVariant).field_0xc == 0xf) {
    bVar5 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  else {
    bVar5 = false;
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_00464260;
  local_180._8_8_ = 0;
  local_180._16_4_ = 0;
  local_180._20_4_ = 1;
  local_180._24_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_88.id = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  local_68 = &p_Stack_38;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (bVar5) {
    pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
    SPIRType::operator=((SPIRType *)local_180,pSVar4);
    local_180._12_4_ = (this->backend).boolean_in_struct_remapped_type;
    bVar5 = true;
  }
  else {
    bVar5 = false;
    if ((iVar1 == 2) && ((this->backend).boolean_in_struct_remapped_type != Boolean)) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
      bVar5 = true;
      SPIRType::operator=((SPIRType *)local_180,pSVar4);
    }
  }
  uVar3 = to_array_size_literal(this,type);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(type->parent_type).id);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ ",(allocator *)&subexpr);
  __val = 0;
  while (uVar3 != __val) {
    ::std::__cxx11::to_string(&local_1c0,__val);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&subexpr,(spirv_cross *)base_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a24a1,
               (char (*) [2])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a23a6,in_R9);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    bVar2 = Compiler::type_is_top_level_array(&this->super_Compiler,pSVar4);
    if (bVar2) {
      to_rerolled_array_expression(&local_1c0,this,parent_type,&subexpr,pSVar4);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1c0);
    }
    else {
      if (bVar5) {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1e0,this,local_180,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1c0,local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                   (char (*) [2])&subexpr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)&subexpr,(string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)local_1e0);
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    __val = __val + 1;
    if (__val < uVar3) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&subexpr);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  SPIRType::~SPIRType((SPIRType *)local_180);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type;
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!type_is_top_level_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}